

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O2

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyPropertyAlias
          (UnicodeSet *this,UnicodeString *prop,UnicodeString *value,UErrorCode *ec)

{
  short sVar1;
  bool bVar2;
  UBool UVar3;
  int iVar4;
  UProperty UVar5;
  UProperty property;
  UChar32 UVar6;
  int32_t iVar7;
  int32_t iVar8;
  char16_t *pcVar9;
  UnicodeSet *pUVar10;
  int32_t dstCapacity;
  double dVar11;
  double val;
  CharString vname;
  CharString pname;
  char *end;
  
  if (U_ZERO_ERROR < *ec) {
    return this;
  }
  if (this->stringSpan != (UnicodeSetStringSpan *)0x0 || this->bmpSet != (BMPSet *)0x0) {
    return this;
  }
  pcVar9 = UnicodeString::getBuffer(prop);
  sVar1 = (prop->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar7 = (prop->fUnion).fFields.fLength;
  }
  else {
    iVar7 = (int)sVar1 >> 5;
  }
  UVar3 = uprv_isInvariantUString_63(pcVar9,iVar7);
  if (UVar3 == '\0') {
LAB_0017eac2:
    *ec = U_ILLEGAL_ARGUMENT_ERROR;
    return this;
  }
  pcVar9 = UnicodeString::getBuffer(value);
  sVar1 = (value->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar7 = (value->fUnion).fFields.fLength;
  }
  else {
    iVar7 = (int)sVar1 >> 5;
  }
  UVar3 = uprv_isInvariantUString_63(pcVar9,iVar7);
  if (UVar3 == '\0') goto LAB_0017eac2;
  MaybeStackArray<char,_40>::MaybeStackArray(&pname.buffer);
  pname.len = 0;
  *pname.buffer.ptr = '\0';
  MaybeStackArray<char,_40>::MaybeStackArray(&vname.buffer);
  vname.len = 0;
  *vname.buffer.ptr = '\0';
  CharString::appendInvariantChars(&pname,prop,ec);
  CharString::appendInvariantChars(&vname,value,ec);
  if (U_ZERO_ERROR < *ec) goto LAB_0017edfb;
  sVar1 = (value->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (value->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (iVar4 < 1) {
    iVar7 = u_getPropertyValueEnum_63(UCHAR_GENERAL_CATEGORY_MASK,pname.buffer.ptr);
    bVar2 = true;
    property = UCHAR_GENERAL_CATEGORY_MASK;
    if (iVar7 == -1) {
      iVar7 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,pname.buffer.ptr);
      if (iVar7 == -1) {
        property = u_getPropertyEnum_63(pname.buffer.ptr);
        iVar7 = 1;
        if (0x40 < (uint)property) {
          iVar8 = uprv_compareASCIIPropertyNames_63("ANY",pname.buffer.ptr);
          if (iVar8 == 0) {
            UVar6 = 0x10ffff;
          }
          else {
            iVar8 = uprv_compareASCIIPropertyNames_63("ASCII",pname.buffer.ptr);
            if (iVar8 != 0) {
              iVar8 = uprv_compareASCIIPropertyNames_63("Assigned",pname.buffer.ptr);
              if (iVar8 != 0) goto LAB_0017edf4;
              bVar2 = false;
              property = UCHAR_GENERAL_CATEGORY_MASK;
              goto LAB_0017ec11;
            }
            UVar6 = 0x7f;
          }
          set(this,0,UVar6);
          goto LAB_0017edfb;
        }
      }
      else {
        property = UCHAR_SCRIPT;
      }
    }
    goto LAB_0017ec11;
  }
  UVar5 = u_getPropertyEnum_63(pname.buffer.ptr);
  if (UVar5 != UCHAR_INVALID_CODE) {
    property = UCHAR_GENERAL_CATEGORY_MASK;
    if (UVar5 != UCHAR_GENERAL_CATEGORY) {
      property = UVar5;
    }
    if (((property == UCHAR_GENERAL_CATEGORY_MASK) || ((uint)property < 0x41)) ||
       ((uint)(property + 0xfffff000) < 0x19)) {
      iVar7 = u_getPropertyValueEnum_63(property,vname.buffer.ptr);
      bVar2 = true;
      if (iVar7 != -1) {
LAB_0017ec11:
        applyIntPropertyValue(this,property,iVar7,ec);
        if (!bVar2) {
          complement(this);
        }
        if (((this->fFlags & 1) != 0) && (*ec < U_ILLEGAL_ARGUMENT_ERROR)) {
          *ec = U_MEMORY_ALLOCATION_ERROR;
        }
        goto LAB_0017edfb;
      }
      if ((((uint)(UVar5 + ~UCHAR_BLOCK) < 0x10) &&
          ((0xc001U >> (UVar5 + ~UCHAR_BLOCK & 0x1fU) & 1) != 0)) &&
         ((dVar11 = strtod(vname.buffer.ptr,&end), *end == '\0' &&
          ((0.0 <= dVar11 && (dVar11 <= 255.0)))))) {
        if ((dVar11 == (double)(int)dVar11) && (!NAN(dVar11) && !NAN((double)(int)dVar11))) {
          iVar7 = (int32_t)dVar11;
          property = UVar5;
          goto LAB_0017ec11;
        }
      }
    }
    else if (UVar5 == UCHAR_OTHER_PROPERTY_START) {
      iVar7 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,vname.buffer.ptr);
      if (iVar7 != -1) {
        bVar2 = true;
        property = UCHAR_OTHER_PROPERTY_START;
        goto LAB_0017ec11;
      }
    }
    else if (UVar5 == UCHAR_AGE) {
      UVar3 = anon_unknown_0::mungeCharName((char *)&end,vname.buffer.ptr,dstCapacity);
      if (UVar3 != '\0') {
        u_versionFromString_63((uint8_t *)&val,(char *)&end);
        pUVar10 = CharacterProperties::getInclusionsForProperty(UCHAR_AGE,ec);
        applyFilter(this,anon_unknown_0::versionFilter,&val,pUVar10,ec);
        goto LAB_0017edfb;
      }
    }
    else if (UVar5 == UCHAR_NAME) {
      UVar3 = anon_unknown_0::mungeCharName((char *)&end,vname.buffer.ptr,dstCapacity);
      if ((UVar3 != '\0') &&
         (UVar6 = u_charFromName_63(U_EXTENDED_CHAR_NAME,(char *)&end,ec),
         *ec < U_ILLEGAL_ARGUMENT_ERROR)) {
        clear(this);
        add(this,UVar6);
        goto LAB_0017edfb;
      }
    }
    else if (((UVar5 != UCHAR_UNICODE_1_NAME) && (UVar5 == UCHAR_DOUBLE_START)) &&
            (val = strtod(vname.buffer.ptr,&end), *end == '\0')) {
      pUVar10 = CharacterProperties::getInclusionsForProperty(UCHAR_DOUBLE_START,ec);
      applyFilter(this,anon_unknown_0::numericValueFilter,&val,pUVar10,ec);
      goto LAB_0017edfb;
    }
  }
LAB_0017edf4:
  *ec = U_ILLEGAL_ARGUMENT_ERROR;
LAB_0017edfb:
  MaybeStackArray<char,_40>::~MaybeStackArray(&vname.buffer);
  MaybeStackArray<char,_40>::~MaybeStackArray(&pname.buffer);
  return this;
}

Assistant:

UnicodeSet&
UnicodeSet::applyPropertyAlias(const UnicodeString& prop,
                               const UnicodeString& value,
                               UErrorCode& ec) {
    if (U_FAILURE(ec) || isFrozen()) return *this;

    // prop and value used to be converted to char * using the default
    // converter instead of the invariant conversion.
    // This should not be necessary because all Unicode property and value
    // names use only invariant characters.
    // If there are any variant characters, then we won't find them anyway.
    // Checking first avoids assertion failures in the conversion.
    if( !uprv_isInvariantUString(prop.getBuffer(), prop.length()) ||
        !uprv_isInvariantUString(value.getBuffer(), value.length())
    ) {
        FAIL(ec);
    }
    CharString pname, vname;
    pname.appendInvariantChars(prop, ec);
    vname.appendInvariantChars(value, ec);
    if (U_FAILURE(ec)) return *this;

    UProperty p;
    int32_t v;
    UBool invert = FALSE;

    if (value.length() > 0) {
        p = u_getPropertyEnum(pname.data());
        if (p == UCHAR_INVALID_CODE) FAIL(ec);

        // Treat gc as gcm
        if (p == UCHAR_GENERAL_CATEGORY) {
            p = UCHAR_GENERAL_CATEGORY_MASK;
        }

        if ((p >= UCHAR_BINARY_START && p < UCHAR_BINARY_LIMIT) ||
            (p >= UCHAR_INT_START && p < UCHAR_INT_LIMIT) ||
            (p >= UCHAR_MASK_START && p < UCHAR_MASK_LIMIT)) {
            v = u_getPropertyValueEnum(p, vname.data());
            if (v == UCHAR_INVALID_CODE) {
                // Handle numeric CCC
                if (p == UCHAR_CANONICAL_COMBINING_CLASS ||
                    p == UCHAR_TRAIL_CANONICAL_COMBINING_CLASS ||
                    p == UCHAR_LEAD_CANONICAL_COMBINING_CLASS) {
                    char* end;
                    double val = uprv_strtod(vname.data(), &end);
                    // Anything between 0 and 255 is valid even if unused.
                    // Cast double->int only after range check.
                    // We catch NaN here because comparing it with both 0 and 255 will be false
                    // (as are all comparisons with NaN).
                    if (*end != 0 || !(0 <= val && val <= 255) ||
                            (v = (int32_t)val) != val) {
                        // non-integral value or outside 0..255, or trailing junk
                        FAIL(ec);
                    }
                } else {
                    FAIL(ec);
                }
            }
        }

        else {

            switch (p) {
            case UCHAR_NUMERIC_VALUE:
                {
                    char* end;
                    double val = uprv_strtod(vname.data(), &end);
                    if (*end != 0) {
                        FAIL(ec);
                    }
                    applyFilter(numericValueFilter, &val,
                                CharacterProperties::getInclusionsForProperty(p, ec), ec);
                    return *this;
                }
            case UCHAR_NAME:
                {
                    // Must munge name, since u_charFromName() does not do
                    // 'loose' matching.
                    char buf[128]; // it suffices that this be > uprv_getMaxCharNameLength
                    if (!mungeCharName(buf, vname.data(), sizeof(buf))) FAIL(ec);
                    UChar32 ch = u_charFromName(U_EXTENDED_CHAR_NAME, buf, &ec);
                    if (U_SUCCESS(ec)) {
                        clear();
                        add(ch);
                        return *this;
                    } else {
                        FAIL(ec);
                    }
                }
            case UCHAR_UNICODE_1_NAME:
                // ICU 49 deprecates the Unicode_1_Name property APIs.
                FAIL(ec);
            case UCHAR_AGE:
                {
                    // Must munge name, since u_versionFromString() does not do
                    // 'loose' matching.
                    char buf[128];
                    if (!mungeCharName(buf, vname.data(), sizeof(buf))) FAIL(ec);
                    UVersionInfo version;
                    u_versionFromString(version, buf);
                    applyFilter(versionFilter, &version,
                                CharacterProperties::getInclusionsForProperty(p, ec), ec);
                    return *this;
                }
            case UCHAR_SCRIPT_EXTENSIONS:
                v = u_getPropertyValueEnum(UCHAR_SCRIPT, vname.data());
                if (v == UCHAR_INVALID_CODE) {
                    FAIL(ec);
                }
                // fall through to calling applyIntPropertyValue()
                break;
            default:
                // p is a non-binary, non-enumerated property that we
                // don't support (yet).
                FAIL(ec);
            }
        }
    }

    else {
        // value is empty.  Interpret as General Category, Script, or
        // Binary property.
        p = UCHAR_GENERAL_CATEGORY_MASK;
        v = u_getPropertyValueEnum(p, pname.data());
        if (v == UCHAR_INVALID_CODE) {
            p = UCHAR_SCRIPT;
            v = u_getPropertyValueEnum(p, pname.data());
            if (v == UCHAR_INVALID_CODE) {
                p = u_getPropertyEnum(pname.data());
                if (p >= UCHAR_BINARY_START && p < UCHAR_BINARY_LIMIT) {
                    v = 1;
                } else if (0 == uprv_comparePropertyNames(ANY, pname.data())) {
                    set(MIN_VALUE, MAX_VALUE);
                    return *this;
                } else if (0 == uprv_comparePropertyNames(ASCII, pname.data())) {
                    set(0, 0x7F);
                    return *this;
                } else if (0 == uprv_comparePropertyNames(ASSIGNED, pname.data())) {
                    // [:Assigned:]=[:^Cn:]
                    p = UCHAR_GENERAL_CATEGORY_MASK;
                    v = U_GC_CN_MASK;
                    invert = TRUE;
                } else {
                    FAIL(ec);
                }
            }
        }
    }

    applyIntPropertyValue(p, v, ec);
    if(invert) {
        complement();
    }

    if (isBogus() && U_SUCCESS(ec)) {
        // We likely ran out of memory. AHHH!
        ec = U_MEMORY_ALLOCATION_ERROR;
    }
    return *this;
}